

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_validators.h
# Opt level: O2

bool cppcms::encoding::iso_8859_8_valid<char_const*>(char *p,char *e,size_t *count)

{
  byte bVar1;
  size_t sVar2;
  
  sVar2 = *count;
  for (; sVar2 = sVar2 + 1, p != e; p = (char *)((byte *)p + 1)) {
    *count = sVar2;
    bVar1 = *p;
    if (((0xd < bVar1) || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0)) &&
       (((bVar1 < 0x20 || ((byte)(bVar1 + 0x81) < 0x21)) ||
        ((((bVar1 - 0xfb < 5 && ((0x13U >> (bVar1 - 0xfb & 0x1f) & 1) != 0)) || (bVar1 == 0xa1)) ||
         ((byte)(bVar1 + 0x41) < 0x20)))))) break;
  }
  return p == e;
}

Assistant:

bool iso_8859_8_valid(Iterator p,Iterator e,size_t &count)
	{
		while(p!=e) {
			count++;
			unsigned c=(unsigned char)*p++;
			if(c==0x09 || c==0xA || c==0xD)
				continue;
			if(c<0x20 || (0x7F<=c && c<0xA0))
				return false;
			switch(c) {
			case 0xA1:
			case 0xFB:
			case 0xFC:
			case 0xFF:
				return false;
			}
			if(0xBF <=c && c<=0xDE)
				return false;
		}
		return true;
	}